

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDfs.c
# Opt level: O2

Vec_Int_t * Gia_ManCollectNodesCis(Gia_Man_t *p,int *pNodes,int nNodes)

{
  Vec_Int_t *vNodes;
  Gia_Obj_t *pGVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  vNodes = Vec_IntAlloc(10000);
  Gia_ManIncrementTravId(p);
  Gia_ObjSetTravIdCurrent(p,p->pObjs);
  uVar5 = 0;
  uVar4 = (ulong)(uint)nNodes;
  if (nNodes < 1) {
    uVar4 = uVar5;
  }
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    pGVar1 = Gia_ManObj(p,pNodes[uVar5]);
    uVar2 = *(ulong *)pGVar1 & 0x1fffffff;
    uVar3 = 0;
    if (uVar2 != 0x1fffffff) {
      uVar3 = -uVar2;
    }
    Gia_ManCollectNodesCis_rec(p,pGVar1 + (uVar3 & (long)(int)*(ulong *)pGVar1 >> 0x1f),vNodes);
  }
  return vNodes;
}

Assistant:

Vec_Int_t * Gia_ManCollectNodesCis( Gia_Man_t * p, int * pNodes, int nNodes )
{
    Vec_Int_t * vNodes;
    Gia_Obj_t * pObj;
    int i; 
    vNodes = Vec_IntAlloc( 10000 );
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrent( p, Gia_ManConst0(p) );
    for ( i = 0; i < nNodes; i++ )
    {
        pObj = Gia_ManObj( p, pNodes[i] );
        if ( Gia_ObjIsCo(pObj) )
            Gia_ManCollectNodesCis_rec( p, Gia_ObjFanin0(pObj), vNodes );
        else
            Gia_ManCollectNodesCis_rec( p, pObj, vNodes );
    }
    return vNodes;
}